

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void CP_ReaderRequestStepHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  WS_ReaderInfo CP_WSR_Stream;
  SstStream s;
  _StepRequest *p_Var1;
  ulong uVar2;
  _StepRequest *p_Var3;
  StepRequest p_Var4;
  char *Format;
  int rank;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  _StepRequest **pp_Var8;
  _CPTimestepEntry *Entry;
  
  CP_WSR_Stream = *Msg_v;
  s = CP_WSR_Stream->ParentStream;
  uVar6 = 0;
  CP_verbose(s,PerStepVerbose,"Reader Request Step  message received for Stream %p.\n",CP_WSR_Stream
            );
  pthread_mutex_lock((pthread_mutex_t *)&CP_WSR_Stream->ParentStream->DataLock);
  if (s->CloseMessagesSent == 0) {
    Entry = s->QueuedTimesteps;
    uVar2 = (ulong)(uint)s->ReaderCount;
    if (s->ReaderCount < 1) {
      uVar2 = uVar6;
    }
    uVar5 = 0xffffffffffffffff;
    for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      if (CP_WSR_Stream == s->Readers[uVar6]) {
        uVar5 = uVar6;
      }
      uVar5 = uVar5 & 0xffffffff;
    }
    rank = (int)uVar5;
    if (rank != -1) {
      for (; Entry != (CPTimestepList)0x0; Entry = Entry->Next) {
        lVar7 = s->LastDemandTimestep + 1;
        CP_verbose(s,TraceVerbose,"In RequestStepHandler, trying to send TS %ld, examining TS %ld\n"
                   ,lVar7,Entry->Timestep);
        if (CP_WSR_Stream->ReaderStatus != Established) break;
        if ((Entry->Timestep == lVar7) && (Entry->InProgressFlag == 0)) {
          if ((Entry->Expired == 0) || (Entry->PreciousTimestep != 0)) {
            CP_verbose(s,PerStepVerbose,
                       "Sending Queued TimestepMetadata for timestep %ld, reference count = %d\n",
                       lVar7,(ulong)(uint)Entry->ReferenceCount);
            s->LastDemandTimestep = Entry->Timestep;
            SendTimestepEntryToSingleReader(s,Entry,CP_WSR_Stream,rank);
            if (s->LastDemandTimestep == s->CloseTimestepCount) {
              SendCloseMsgs(s);
            }
            goto LAB_00115ac1;
          }
          CP_verbose(s,TraceVerbose,
                     "Reader send queued skipping  TS %ld, expired and not precious\n",lVar7,lVar7);
        }
      }
      CP_verbose(s,TraceVerbose,"In RequestStepHandler, queueing request\n");
      p_Var3 = (_StepRequest *)calloc(0x10,1);
      p_Var3->RequestingReader = rank;
      p_Var1 = s->StepRequestQueue;
      if (s->StepRequestQueue == (StepRequest)0x0) {
        pp_Var8 = &s->StepRequestQueue;
      }
      else {
        do {
          p_Var4 = p_Var1;
          p_Var1 = p_Var4->Next;
        } while (p_Var1 != (_StepRequest *)0x0);
        pp_Var8 = &p_Var4->Next;
      }
      *pp_Var8 = p_Var3;
      goto LAB_00115ac1;
    }
    Format = "In RequestStepHandler, RequestingReader not found, ignore\n";
  }
  else {
    Format = "In RequestStepHandler, stream closing, ignore\n";
  }
  CP_verbose(s,TraceVerbose,Format);
LAB_00115ac1:
  pthread_mutex_unlock((pthread_mutex_t *)&CP_WSR_Stream->ParentStream->DataLock);
  return;
}

Assistant:

void CP_ReaderRequestStepHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                                 attr_list attrs)
{
    struct _ReaderRequestStepMsg *Msg = (struct _ReaderRequestStepMsg *)Msg_v;

    WS_ReaderInfo CP_WSR_Stream = Msg->WSR_Stream;
    SstStream Stream = CP_WSR_Stream->ParentStream;
    CP_verbose(CP_WSR_Stream->ParentStream, PerStepVerbose,
               "Reader Request Step  message received "
               "for Stream %p.\n",
               CP_WSR_Stream);
    if (CP_WSR_Stream->ParentStream->ConfigParams->CPCommPattern == SstCPCommPeer)
    {
        assert(0);
    }

    STREAM_MUTEX_LOCK(CP_WSR_Stream->ParentStream);
    CPTimestepList List = Stream->QueuedTimesteps;
    if (Stream->CloseMessagesSent)
    {
        CP_verbose(Stream, TraceVerbose, "In RequestStepHandler, stream closing, ignore\n");
        STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
        return;
    }
    int RequestingReader = -1;
    for (int i = 0; i < Stream->ReaderCount; i++)
    {
        if (CP_WSR_Stream == Stream->Readers[i])
        {
            RequestingReader = i;
        }
    }
    if (RequestingReader == -1)
    {
        CP_verbose(Stream, TraceVerbose,
                   "In RequestStepHandler, RequestingReader not found, ignore\n");
        STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
        return;
    }

    while (List)
    {
        size_t NextTS = Stream->LastDemandTimestep + 1;
        CP_verbose(Stream, TraceVerbose,
                   "In RequestStepHandler, trying to send TS %ld, examining TS %ld\n", NextTS,
                   List->Timestep);
        if (CP_WSR_Stream->ReaderStatus != Established)
        {
            break; /* break out of while if we've fallen out of established
                    */
        }
        if ((List->Timestep == NextTS) && !List->InProgressFlag)
        {
            if (List->Expired && !List->PreciousTimestep)
            {
                CP_verbose(Stream, TraceVerbose,
                           "Reader send queued skipping  TS %ld, expired "
                           "and not precious\n",
                           List->Timestep, NextTS);
                List = List->Next;
                continue; /* skip timestep is expired, but not
                             precious */
            }
            CP_verbose(Stream, PerStepVerbose,
                       "Sending Queued TimestepMetadata for timestep %ld, "
                       "reference count = %d\n",
                       NextTS, List->ReferenceCount);

            Stream->LastDemandTimestep = List->Timestep;
            SendTimestepEntryToSingleReader(Stream, List, CP_WSR_Stream, RequestingReader);
            if (Stream->LastDemandTimestep == Stream->CloseTimestepCount)
            {
                /* send if all timesteps have been send OnDemand */
                SendCloseMsgs(Stream);
            }
            STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
            return;
        }
        List = List->Next;
    }

    CP_verbose(Stream, TraceVerbose, "In RequestStepHandler, queueing request\n");
    StepRequest Request = calloc(sizeof(*Request), 1);
    Request->RequestingReader = RequestingReader;
    if (!Stream->StepRequestQueue)
    {
        Stream->StepRequestQueue = Request;
    }
    else
    {
        StepRequest Last = Stream->StepRequestQueue;
        while (Last->Next)
            Last = Last->Next;
        Last->Next = Request;
    }
    STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
}